

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O1

int hts_set_fai_filename(htsFile *fp,char *fn_aux)

{
  char *pcVar1;
  
  free(fp->fn_aux);
  if (fn_aux == (char *)0x0) {
    fp->fn_aux = (char *)0x0;
  }
  else {
    pcVar1 = strdup(fn_aux);
    fp->fn_aux = pcVar1;
    if (pcVar1 == (char *)0x0) {
      return -1;
    }
  }
  if ((fp->format).format == cram) {
    cram_set_option((fp->fp).cram,CRAM_OPT_REFERENCE,fp->fn_aux);
  }
  return 0;
}

Assistant:

int hts_set_fai_filename(htsFile *fp, const char *fn_aux)
{
    free(fp->fn_aux);
    if (fn_aux) {
        fp->fn_aux = strdup(fn_aux);
        if (fp->fn_aux == NULL) return -1;
    }
    else fp->fn_aux = NULL;

    if (fp->format.format == cram)
        cram_set_option(fp->fp.cram, CRAM_OPT_REFERENCE, fp->fn_aux);

    return 0;
}